

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD5Parser.h
# Opt level: O0

void Assimp::MD5::ConvertQuaternion(aiVector3D *in,aiQuaternion *out)

{
  float fVar1;
  double dVar2;
  float t;
  aiQuaternion *out_local;
  aiVector3D *in_local;
  
  out->x = in->x;
  out->y = in->y;
  out->z = in->z;
  fVar1 = -in->z * in->z + -in->y * in->y + -in->x * in->x + 1.0;
  if (0.0 <= fVar1) {
    dVar2 = std::sqrt((double)(ulong)(uint)fVar1);
    out->w = SUB84(dVar2,0);
  }
  else {
    out->w = 0.0;
  }
  out->w = out->w * -1.0;
  return;
}

Assistant:

inline void ConvertQuaternion (const aiVector3D& in, aiQuaternion& out) {

    out.x = in.x;
    out.y = in.y;
    out.z = in.z;

    const float t = 1.0f - (in.x*in.x) - (in.y*in.y) - (in.z*in.z);

    if (t < 0.0f)
        out.w = 0.0f;
    else out.w = std::sqrt (t);

    // Assimp convention.
    out.w *= -1.f;
}